

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unixClose(unqlite_file *id)

{
  _func_int_unqlite_file_ptr_void_ptr_unqlite_int64_unqlite_int64 **pp_Var1;
  unqlite_io_methods *p;
  unqlite_io_methods *puVar2;
  unixInodeInfo *puVar3;
  unixInodeInfo *puVar4;
  int iVar5;
  int *piVar6;
  unixInodeInfo **ppuVar7;
  unixInodeInfo *pInode;
  
  if (id == (unqlite_file *)0x0) {
    return 0;
  }
  unixUnlock(id,0);
  p = id[1].pMethods;
  if (p != (unqlite_io_methods *)0x0) {
    if (*(int *)((long)&p->xWrite + 4) != 0) {
      puVar2 = id[5].pMethods;
      puVar2->xClose = (_func_int_unqlite_file_ptr *)p->xTruncate;
      p->xTruncate = (_func_int_unqlite_file_ptr_unqlite_int64 *)puVar2;
      *(undefined4 *)&id[2].pMethods = 0xffffffff;
      id[5].pMethods = (unqlite_io_methods *)0x0;
    }
    pp_Var1 = &p->xWrite;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    if (*(int *)pp_Var1 == 0) {
      closePendingFds((unixFile *)id);
      puVar3 = (unixInodeInfo *)p->xSync;
      puVar4 = (unixInodeInfo *)p->xFileSize;
      ppuVar7 = &inodeList;
      if (puVar4 != (unixInodeInfo *)0x0) {
        ppuVar7 = &puVar4->pNext;
      }
      *ppuVar7 = puVar3;
      if (puVar3 != (unixInodeInfo *)0x0) {
        puVar3->pPrev = puVar4;
      }
      unqlite_free(p);
    }
  }
  iVar5 = *(int *)((long)&id[2].pMethods + 4);
  if (iVar5 < 0) {
LAB_0010eee8:
    if (-1 < *(int *)&id[2].pMethods) {
      iVar5 = close(*(int *)&id[2].pMethods);
      if (iVar5 != 0) goto LAB_0010eef8;
    }
    unqlite_free(id[5].pMethods);
    SyZero(id,0x48);
    iVar5 = 0;
  }
  else {
    iVar5 = close(iVar5);
    if (iVar5 == 0) {
      *(undefined4 *)((long)&id[2].pMethods + 4) = 0xffffffff;
      goto LAB_0010eee8;
    }
LAB_0010eef8:
    piVar6 = __errno_location();
    *(int *)((long)&id[3].pMethods + 4) = *piVar6;
    iVar5 = -2;
  }
  return iVar5;
}

Assistant:

static int unixClose(unqlite_file *id){
  int rc = UNQLITE_OK;
  if( id ){
    unixFile *pFile = (unixFile *)id;
    unixUnlock(id, NO_LOCK);
    unixEnterMutex();
    if( pFile->pInode && pFile->pInode->nLock ){
      /* If there are outstanding locks, do not actually close the file just
      ** yet because that would clear those locks.  Instead, add the file
      ** descriptor to pInode->pUnused list.  It will be automatically closed 
      ** when the last lock is cleared.
      */
      setPendingFd(pFile);
    }
    releaseInodeInfo(pFile);
    rc = closeUnixFile(id);
    unixLeaveMutex();
  }
  return rc;
}